

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Scanner::removeSimpleKeyCandidatesOnFlowLevel(Scanner *this,uint Level)

{
  void *pvVar1;
  bool bVar2;
  size_t sVar3;
  uint Level_local;
  Scanner *this_local;
  
  bVar2 = SmallVectorBase::empty((SmallVectorBase *)&this->SimpleKeys);
  if (!bVar2) {
    pvVar1 = (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
             super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
             super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
             super_SmallVectorBase.BeginX;
    sVar3 = SmallVectorBase::size((SmallVectorBase *)&this->SimpleKeys);
    if (*(uint *)((long)pvVar1 + sVar3 * 0x18 + -8) == Level) {
      SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>::pop_back
                ((SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true> *)
                 &this->SimpleKeys);
    }
  }
  return;
}

Assistant:

void Scanner::removeSimpleKeyCandidatesOnFlowLevel(unsigned Level) {
  if (!SimpleKeys.empty() && (SimpleKeys.end() - 1)->FlowLevel == Level)
    SimpleKeys.pop_back();
}